

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O1

boolean obj_is_local(obj *obj)

{
  char cVar1;
  monst **ppmVar2;
  
  while (cVar1 = ((monst *)obj)->mtrack[2].x, cVar1 == '\x02') {
    obj = (obj *)((vptrs *)&((monst *)obj)->data)->v_ocarry;
  }
  switch(cVar1) {
  case '\x01':
  case '\x05':
    return '\x01';
  default:
    panic("obj_is_local");
  case '\x03':
  case '\a':
    goto LAB_0025d4c5;
  case '\x04':
    ppmVar2 = &migrating_mons;
    do {
      ppmVar2 = &((monst *)ppmVar2)->nmon->nmon;
      if ((monst *)ppmVar2 == (monst *)0x0) {
        ppmVar2 = &mydogs;
        do {
          ppmVar2 = &((monst *)ppmVar2)->nmon->nmon;
          if ((monst *)ppmVar2 == (monst *)0x0) {
            return '\x01';
          }
        } while ((monst *)ppmVar2 != (monst *)((monst *)obj)->data);
        return '\0';
      }
    } while ((monst *)ppmVar2 != (monst *)((monst *)obj)->data);
LAB_0025d4c5:
    return '\0';
  }
}

Assistant:

boolean obj_is_local(struct obj *obj)
{
    switch (obj->where) {
	case OBJ_INVENT:
	case OBJ_MAGIC_CHEST:	return FALSE;
	case OBJ_FLOOR:
	case OBJ_BURIED:	return TRUE;
	case OBJ_CONTAINED:	return obj_is_local(obj->ocontainer);
	case OBJ_MINVENT:	return mon_is_local(obj->ocarry);
    }
    panic("obj_is_local");
    return FALSE;
}